

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Tags.cpp
# Opt level: O0

void RenX::replace_tag(string *fmt,string_view tag,string_view internal_tag)

{
  string_view internal_tag_00;
  string_view tag_00;
  _If_sv<std::basic_string_view<char>,_size_type> __pos;
  size_type __n;
  size_t tag_pos;
  string *fmt_local;
  string_view internal_tag_local;
  string_view tag_local;
  
  internal_tag_local._M_len = (size_t)internal_tag._M_str;
  fmt_local = (string *)internal_tag._M_len;
  internal_tag_local._M_str = (char *)tag._M_len;
  __pos = std::__cxx11::string::find<std::basic_string_view<char,std::char_traits<char>>>
                    ((string *)fmt,
                     (basic_string_view<char,_std::char_traits<char>_> *)&internal_tag_local._M_str,
                     0);
  if (__pos != 0xffffffffffffffff) {
    __n = std::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)&internal_tag_local._M_str)
    ;
    std::__cxx11::string::replace<std::basic_string_view<char,std::char_traits<char>>>
              ((string *)fmt,__pos,__n,
               (basic_string_view<char,_std::char_traits<char>_> *)&fmt_local);
    tag_00._M_str = tag._M_str;
    tag_00._M_len = (size_t)internal_tag_local._M_str;
    internal_tag_00._M_str = (char *)internal_tag_local._M_len;
    internal_tag_00._M_len = (size_t)fmt_local;
    replace_tag(fmt,tag_00,internal_tag_00);
  }
  return;
}

Assistant:

void RenX::replace_tag(std::string& fmt, std::string_view tag, std::string_view internal_tag) {
	// Search for tag
	size_t tag_pos = fmt.find(tag);
	if (tag_pos == std::string::npos) {
		return;
	}

	// Replace the tag
	fmt.replace(tag_pos, tag.size(), internal_tag);

	// Recurse for any further instances; less efficient than old replace() but should be rare anyways
	replace_tag(fmt, tag, internal_tag);
}